

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::ruby::GenerateMessageAssignment
          (ruby *this,string_view prefix,Descriptor *message,Printer *printer)

{
  string_view name;
  string_view name_00;
  _Alloc_hider _Var1;
  size_type sVar2;
  Descriptor *pDVar3;
  EnumDescriptor *pEVar4;
  Descriptor *this_00;
  int i;
  int iVar5;
  Printer *printer_00;
  string_view text;
  string_view text_00;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_local;
  string nested_prefix;
  undefined1 local_d8 [48];
  AnnotationCollector *local_a8;
  pointer local_a0;
  AlphaNum local_88;
  AlphaNum local_58;
  
  this_00 = (Descriptor *)prefix._M_str;
  prefix_local._M_str = (char *)prefix._M_len;
  if ((this_00->options_->field_0)._impl_.map_entry_ == false) {
    name._M_str = (char *)nested_prefix._M_string_length;
    name._M_len = (size_t)nested_prefix._M_dataplus._M_p;
    prefix_local._M_len = (size_t)this;
    RubifyConstant_abi_cxx11_(name);
    text._M_str = "$prefix$$name$ = ";
    text._M_len = 0x11;
    io::Printer::
    Print<char[7],std::basic_string_view<char,std::char_traits<char>>,char[5],std::__cxx11::string>
              ((Printer *)message,text,(char (*) [7])0x10a7cf9,&prefix_local,(char (*) [5])0xd8d1e3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    local_d8._8_8_ = (this_00->all_names_).payload_;
    local_d8._0_8_ = ZEXT28(*(ushort *)(local_d8._8_8_ + 2));
    local_d8._8_8_ = local_d8._8_8_ + ~local_d8._0_8_;
    printer_00 = (Printer *)local_d8;
    text_00._M_str =
         "::Google::Protobuf::DescriptorPool.generated_pool.lookup(\"$full_name$\").msgclass\n";
    text_00._M_len = 0x51;
    io::Printer::Print<char[10],std::basic_string_view<char,std::char_traits<char>>>
              ((Printer *)message,text_00,(char (*) [10])0x10a7999,
               (basic_string_view<char,_std::char_traits<char>_> *)printer_00);
    local_d8._0_8_ = prefix_local._M_len;
    local_d8._8_8_ = prefix_local._M_str;
    name_00._M_str = (char *)nested_prefix._M_string_length;
    name_00._M_len = (size_t)nested_prefix._M_dataplus._M_p;
    RubifyConstant_abi_cxx11_(name_00);
    local_58.piece_._M_len = (size_t)local_a0;
    local_58.piece_._M_str = (char *)local_a8;
    local_88.piece_ = absl::lts_20250127::NullSafeStringView("::");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&nested_prefix,(lts_20250127 *)local_d8,&local_58,&local_88,(AlphaNum *)printer_00);
    std::__cxx11::string::~string((string *)&local_a8);
    for (iVar5 = 0; sVar2 = nested_prefix._M_string_length,
        _Var1._M_p = nested_prefix._M_dataplus._M_p, iVar5 < this_00->nested_type_count_;
        iVar5 = iVar5 + 1) {
      pDVar3 = Descriptor::nested_type(this_00,iVar5);
      prefix_00._M_str = (char *)pDVar3;
      prefix_00._M_len = (size_t)_Var1._M_p;
      GenerateMessageAssignment((ruby *)sVar2,prefix_00,message,printer_00);
    }
    for (iVar5 = 0; sVar2 = nested_prefix._M_string_length,
        _Var1._M_p = nested_prefix._M_dataplus._M_p, iVar5 < this_00->enum_type_count_;
        iVar5 = iVar5 + 1) {
      pEVar4 = Descriptor::enum_type(this_00,iVar5);
      prefix_01._M_str = (char *)pEVar4;
      prefix_01._M_len = (size_t)_Var1._M_p;
      GenerateEnumAssignment((ruby *)sVar2,prefix_01,(EnumDescriptor *)message,printer_00);
    }
    std::__cxx11::string::~string((string *)&nested_prefix);
  }
  return;
}

Assistant:

void GenerateMessageAssignment(absl::string_view prefix,
                               const Descriptor* message,
                               io::Printer* printer) {
  // Don't generate MapEntry messages -- we use the Ruby extension's native
  // support for map fields instead.
  if (message->options().map_entry()) {
    return;
  }

  printer->Print("$prefix$$name$ = ", "prefix", prefix, "name",
                 RubifyConstant(message->name()));
  printer->Print(
      "::Google::Protobuf::DescriptorPool.generated_pool."
      "lookup(\"$full_name$\").msgclass\n",
      "full_name", message->full_name());

  std::string nested_prefix =
      absl::StrCat(prefix, RubifyConstant(message->name()), "::");
  for (int i = 0; i < message->nested_type_count(); i++) {
    GenerateMessageAssignment(nested_prefix, message->nested_type(i), printer);
  }
  for (int i = 0; i < message->enum_type_count(); i++) {
    GenerateEnumAssignment(nested_prefix, message->enum_type(i), printer);
  }
}